

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSession::BYEDestroy
          (RTPSession *this,RTPTime *maxwaittime,void *reason,size_t reasonlength)

{
  RTPTransmitter *obj;
  RTCPCompoundPacket *pRVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  reference ppRVar5;
  uint8_t *data;
  RTPMemoryManager *pRVar6;
  reference ppRVar7;
  double local_a0;
  iterator local_88;
  _List_const_iterator<jrtplib::RTCPCompoundPacket_*> local_80;
  iterator local_78;
  _List_const_iterator<jrtplib::RTCPCompoundPacket_*> local_70;
  _List_const_iterator<jrtplib::RTCPCompoundPacket_*> local_68;
  const_iterator it;
  _List_iterator<jrtplib::RTCPCompoundPacket_*> local_58;
  _List_iterator<jrtplib::RTCPCompoundPacket_*> local_50;
  RTPTime local_48;
  RTPTime curtime;
  bool done;
  RTCPCompoundPacket *pRStack_38;
  int status;
  RTCPCompoundPacket *pack;
  RTPTime stoptime;
  size_t reasonlength_local;
  void *reason_local;
  RTPTime *maxwaittime_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) != 0) {
    stoptime.m_t = (double)reasonlength;
    pack = (RTCPCompoundPacket *)RTPTime::CurrentTime();
    RTPTime::operator+=((RTPTime *)&pack,maxwaittime);
    if ((this->sentpackets & 1U) != 0) {
      if ((ulong)stoptime.m_t < 0x100) {
        local_a0 = stoptime.m_t;
      }
      else {
        local_a0 = 1.25986739689518e-321;
      }
      stoptime.m_t = local_a0;
      curtime.m_t._4_4_ =
           RTCPPacketBuilder::BuildBYEPacket
                     (&this->rtcpbuilder,&stack0xffffffffffffffc8,reason,(size_t)local_a0,
                      (bool)(this->useSR_BYEifpossible & 1));
      if (-1 < curtime.m_t._4_4_) {
        std::__cxx11::
        list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
        push_back(&this->byepackets,&stack0xffffffffffffffc8);
        sVar3 = std::__cxx11::
                list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                ::size(&this->byepackets);
        if (sVar3 == 1) {
          sVar4 = RTCPCompoundPacket::GetCompoundPacketLength(pRStack_38);
          RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,sVar4);
        }
      }
    }
    bVar2 = std::__cxx11::
            list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
            empty(&this->byepackets);
    if (!bVar2) {
      curtime.m_t._3_1_ = 0;
      while (((curtime.m_t._3_1_ ^ 0xff) & 1) != 0) {
        local_48 = RTPTime::CurrentTime();
        bVar2 = RTPTime::operator>=(&local_48,(RTPTime *)&pack);
        if (bVar2) {
          curtime.m_t._3_1_ = 1;
        }
        bVar2 = RTCPScheduler::IsTime(&this->rtcpsched);
        if (bVar2) {
          local_50._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
               begin(&this->byepackets);
          ppRVar5 = std::_List_iterator<jrtplib::RTCPCompoundPacket_*>::operator*(&local_50);
          pRStack_38 = *ppRVar5;
          std::__cxx11::
          list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
          pop_front(&this->byepackets);
          data = RTCPCompoundPacket::GetCompoundPacketData(pRStack_38);
          sVar4 = RTCPCompoundPacket::GetCompoundPacketLength(pRStack_38);
          SendRTCPData(this,data,sVar4);
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,pRStack_38);
          pRVar1 = pRStack_38;
          pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTCPCompoundPacket>(pRVar1,pRVar6);
          bVar2 = std::__cxx11::
                  list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                  ::empty(&this->byepackets);
          if (bVar2) {
            curtime.m_t._3_1_ = 1;
          }
          else {
            local_58._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                 ::begin(&this->byepackets);
            ppRVar5 = std::_List_iterator<jrtplib::RTCPCompoundPacket_*>::operator*(&local_58);
            sVar4 = RTCPCompoundPacket::GetCompoundPacketLength(*ppRVar5);
            RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,sVar4);
          }
        }
        if ((curtime.m_t._3_1_ & 1) == 0) {
          RTPTime::RTPTime((RTPTime *)&it,0,100000);
          RTPTime::Wait((RTPTime *)&it);
        }
      }
    }
    if ((this->deletetransmitter & 1U) != 0) {
      obj = this->rtptrans;
      pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPTransmitter>(obj,pRVar6);
    }
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
    RTCPScheduler::Reset(&this->rtcpsched);
    RTPCollisionList::Clear(&this->collisionlist);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::_List_const_iterator(&local_68);
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::begin
                   (&this->byepackets);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::_List_const_iterator
              (&local_70,&local_78);
    local_68._M_node = local_70._M_node;
    while( true ) {
      local_88._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::end
                     (&this->byepackets);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::_List_const_iterator
                (&local_80,&local_88);
      bVar2 = std::operator!=(&local_68,&local_80);
      if (!bVar2) break;
      ppRVar7 = std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::operator*(&local_68);
      pRVar1 = *ppRVar7;
      pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTCPCompoundPacket>(pRVar1,pRVar6);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::operator++(&local_68,0);
    }
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::clear
              (&this->byepackets);
    this->created = false;
  }
  return;
}

Assistant:

void RTPSession::BYEDestroy(const RTPTime &maxwaittime,const void *reason,size_t reasonlength)
{
	if (!created)
		return;

	// first, stop the thread so we have full control over all components
	
#ifdef RTP_SUPPORT_THREAD
	if (pollthread)
		RTPDelete(pollthread,GetMemoryManager());
#endif // RTP_SUPPORT_THREAD

	RTPTime stoptime = RTPTime::CurrentTime();
	stoptime += maxwaittime;

	// add bye packet to the list if we've sent data

	RTCPCompoundPacket *pack;

	if (sentpackets)
	{
		int status;
		
		reasonlength = (reasonlength>RTCP_BYE_MAXREASONLENGTH)?RTCP_BYE_MAXREASONLENGTH:reasonlength;
	       	status = rtcpbuilder.BuildBYEPacket(&pack,reason,reasonlength,useSR_BYEifpossible);
		if (status >= 0)
		{
			byepackets.push_back(pack);
	
			if (byepackets.size() == 1)
				rtcpsched.ScheduleBYEPacket(pack->GetCompoundPacketLength());
		}
	}
	
	if (!byepackets.empty())
	{
		bool done = false;
		
		while (!done)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			
			if (curtime >= stoptime)
				done = true;
		
			if (rtcpsched.IsTime())
			{
				pack = *(byepackets.begin());
				byepackets.pop_front();
			
				SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength());
				
				OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
				
				RTPDelete(pack,GetMemoryManager());
				if (!byepackets.empty()) // more bye packets to send, schedule them
					rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				else
					done = true;
			}
			if (!done)
				RTPTime::Wait(RTPTime(0,100000));
		}
	}
	
	if (deletetransmitter)
		RTPDelete(rtptrans,GetMemoryManager());
	packetbuilder.Destroy();
	rtcpbuilder.Destroy();
	rtcpsched.Reset();
	collisionlist.Clear();
	sources.Clear();

	// clear rest of bye packets
	std::list<RTCPCompoundPacket *>::const_iterator it;

	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	byepackets.clear();
	
	created = false;
}